

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_mesh.cpp
# Opt level: O0

real sdf_tools::sdf::computeDistanceToMesh
               (real3 r,vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_> *faces,
               vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_> *vertices)

{
  real3 a_00;
  real3 a_01;
  bool bVar1;
  const_reference pvVar2;
  reference piVar3;
  float *pfVar4;
  vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_> *in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  real3 rVar5;
  real3 c;
  real3 b;
  real3 a;
  int3 t;
  const_iterator __end2;
  const_iterator __begin2;
  vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_> *__range2;
  real distance;
  real3 in_stack_000003b8;
  real3 in_stack_000003d8;
  real3 in_stack_000003f8;
  real3 in_stack_00000418;
  vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_> *in_stack_fffffffffffffe88;
  real in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffec8;
  real in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  real in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  real in_stack_fffffffffffffef0;
  real local_fc;
  vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_> *local_f8;
  real local_f0;
  undefined8 local_e8;
  real local_e0;
  undefined8 local_d8;
  real local_d0;
  undefined8 local_c8;
  int local_c0;
  int3 *local_b8;
  __normal_iterator<const_sdf_tools::int3_*,_std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>_>
  local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  real local_98;
  real3 local_90;
  undefined8 local_80;
  real local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_60;
  real local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  real local_38;
  float local_34;
  vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_> *local_30;
  undefined8 local_28;
  
  local_50 = in_XMM0_Qa;
  local_48 = in_XMM1_Da;
  local_30 = in_RSI;
  local_28 = in_RDI;
  pvVar2 = std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>::operator[](in_RSI,0);
  local_78 = pvVar2->z;
  local_80._0_4_ = pvVar2->x;
  local_80._4_4_ = pvVar2->y;
  local_68 = local_48;
  local_70 = local_50;
  a_01.z = in_stack_fffffffffffffef0;
  a_01.x = (real)(int)in_stack_fffffffffffffee8;
  a_01.y = (real)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  rVar5.z = in_stack_fffffffffffffed0;
  rVar5.x = (real)(int)in_stack_fffffffffffffec8;
  rVar5.y = (real)(int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_60 = local_80;
  local_58 = local_78;
  rVar5 = sdf_tools::operator-(a_01,rVar5);
  local_90.z = rVar5.z;
  local_38 = local_90.z;
  local_90._0_8_ = rVar5._0_8_;
  local_40._0_4_ = local_90.x;
  local_40._4_4_ = local_90.y;
  local_98 = local_90.z;
  local_a0._0_4_ = local_90.x;
  local_a0._4_4_ = local_90.y;
  a_00.z = in_stack_fffffffffffffee0;
  a_00.x = (real)(int)in_stack_fffffffffffffed8;
  a_00.y = (real)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_90 = rVar5;
  local_34 = length(a_00);
  local_a8 = local_28;
  local_b0._M_current =
       (int3 *)std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>::begin
                         (in_stack_fffffffffffffe88);
  local_b8 = (int3 *)std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>::end
                               (in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_sdf_tools::int3_*,_std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       (__normal_iterator<const_sdf_tools::int3_*,_std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::
             __normal_iterator<const_sdf_tools::int3_*,_std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>_>
             ::operator*(&local_b0);
    local_c0 = piVar3->z;
    local_c8._0_4_ = piVar3->x;
    local_c8._4_4_ = piVar3->y;
    pvVar2 = std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>::operator[]
                       (local_30,(long)(int)(undefined4)local_c8);
    local_d0 = pvVar2->z;
    local_d8._0_4_ = pvVar2->x;
    local_d8._4_4_ = pvVar2->y;
    pvVar2 = std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>::operator[]
                       (local_30,(long)local_c8._4_4_);
    local_e0 = pvVar2->z;
    local_e8._0_4_ = pvVar2->x;
    local_e8._4_4_ = pvVar2->y;
    pvVar2 = std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>::operator[]
                       (local_30,(long)local_c0);
    in_stack_fffffffffffffe90 = pvVar2->z;
    in_stack_fffffffffffffe88 =
         *(vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_> **)pvVar2;
    local_f8 = in_stack_fffffffffffffe88;
    local_f0 = in_stack_fffffffffffffe90;
    local_fc = distanceToTriangle(in_stack_00000418,in_stack_000003f8,in_stack_000003d8,
                                  in_stack_000003b8);
    pfVar4 = std::min<float>(&local_34,&local_fc);
    local_34 = *pfVar4;
    __gnu_cxx::
    __normal_iterator<const_sdf_tools::int3_*,_std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>_>
    ::operator++(&local_b0);
  }
  return local_34;
}

Assistant:

static real computeDistanceToMesh(real3 r,
                                  const std::vector<int3>& faces,
                                  const std::vector<real3>& vertices)
{
    real distance = length(r - vertices[0]);
    for (const int3 t : faces)
    {
        const real3 a = vertices[t.x];
        const real3 b = vertices[t.y];
        const real3 c = vertices[t.z];

        distance = std::min(distance, distanceToTriangle(r, a, b, c));
    }
    return distance;
}